

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsgf.c
# Opt level: O2

jsgf_rule_t * jsgf_get_rule(jsgf_t *grammar,char *name)

{
  int32 iVar1;
  jsgf_rule_t *in_RAX;
  char *key;
  jsgf_rule_t *pjVar2;
  void *val;
  jsgf_rule_t *local_28;
  
  local_28 = in_RAX;
  key = string_join("<",name,">",0);
  iVar1 = hash_table_lookup(grammar->rules,key,&local_28);
  ckd_free(key);
  pjVar2 = (jsgf_rule_t *)0x0;
  if (-1 < iVar1) {
    pjVar2 = local_28;
  }
  return pjVar2;
}

Assistant:

jsgf_rule_t *
jsgf_get_rule(jsgf_t * grammar, char const *name)
{
    void *val;
    char *fullname;

    fullname = string_join("<", name, ">", NULL);
    if (hash_table_lookup(grammar->rules, fullname, &val) < 0) {
        ckd_free(fullname);
        return NULL;
    }
    ckd_free(fullname);
    return (jsgf_rule_t *) val;
}